

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL is_var_in_arg_scope(JSVarDef *vd)

{
  uint uVar1;
  
  uVar1 = vd->var_name - 0x53;
  if (((0x20 < uVar1) || ((0x1c0000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) && (vd->var_name != 8))
  {
    return (BOOL)((*(uint *)&vd->field_0xc & 0x78) == 0x20);
  }
  return 1;
}

Assistant:

static BOOL is_var_in_arg_scope(const JSVarDef *vd)
{
    return (vd->var_name == JS_ATOM_home_object ||
            vd->var_name == JS_ATOM_this_active_func ||
            vd->var_name == JS_ATOM_new_target ||
            vd->var_name == JS_ATOM_this ||
            vd->var_name == JS_ATOM__arg_var_ ||
            vd->var_kind == JS_VAR_FUNCTION_NAME);
}